

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputFile1.unit.cpp
# Opt level: O2

void __thiscall TestFile1::SetUp(TestFile1 *this)

{
  string inputContent;
  ofstream out;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputContent,
             "{ Units, Wavelength Units } SI Microns\n{ Thickness } 3.048 \n{ Conductivity } 1\n{ IR Transmittance } TIR=0\n{ Emissivity, front back } Emis= 0.84 0.84\n{ }\n{ Ef_Source: Material }\n{ Eb_Source: Material }\n{ IGDB_Checksum: -1717699038 }\n{ Product Name: Generic Clear Glass }\n{ Manufacturer: Generic }\n{ NFRC ID: 102 }\n{ Type: Monolithic }\n{ Material: Glass }\n{ Coating Name: N/A }\n{ Coated Side: Neither }\n{ Substrate Filename: N/A }\n{ Appearance: Clear }\n{ Acceptance: # }\n{ Uses:  }\n{ Availability:   }\n{ Structure:  }\n0.300    0.0020    0.0470    0.0480\n0.305    0.0030    0.0470    0.0480\n0.310    0.0090    0.0470    0.0480\n0.315    0.0350    0.0470    0.0480\n0.320    0.1000    0.0470    0.0480\n0.325    0.2180    0.0490    0.0500"
             ,(allocator<char> *)&out);
  std::ofstream::ofstream(&out,"InputFile1.dat",_S_out);
  std::operator<<((ostream *)&out,(string *)&inputContent);
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  std::__cxx11::string::~string((string *)&inputContent);
  return;
}

Assistant:

void SetUp() override
	{
		std::string inputContent = "{ Units, Wavelength Units } SI Microns\n"
			"{ Thickness } 3.048 \n"
			"{ Conductivity } 1\n"
			"{ IR Transmittance } TIR=0\n"
			"{ Emissivity, front back } Emis= 0.84 0.84\n"
			"{ }\n"
			"{ Ef_Source: Material }\n"
			"{ Eb_Source: Material }\n"
			"{ IGDB_Checksum: -1717699038 }\n"
			"{ Product Name: Generic Clear Glass }\n"
			"{ Manufacturer: Generic }\n"
			"{ NFRC ID: 102 }\n"
			"{ Type: Monolithic }\n"
			"{ Material: Glass }\n"
			"{ Coating Name: N/A }\n"
			"{ Coated Side: Neither }\n"
			"{ Substrate Filename: N/A }\n"
			"{ Appearance: Clear }\n"
			"{ Acceptance: # }\n"
			"{ Uses:  }\n"
			"{ Availability:   }\n"
			"{ Structure:  }\n"
			"0.300    0.0020    0.0470    0.0480\n"
			"0.305    0.0030    0.0470    0.0480\n"
			"0.310    0.0090    0.0470    0.0480\n"
			"0.315    0.0350    0.0470    0.0480\n"
			"0.320    0.1000    0.0470    0.0480\n"
			"0.325    0.2180    0.0490    0.0500";

		std::ofstream out("InputFile1.dat");
		out << inputContent;
		out.close();
	}